

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::convertFromXYZ
               (uchar *out,float *in,uint w,uint h,LodePNGState *state,float *whitepoint,
               uint rendering_intent)

{
  float *pfVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  int in_ECX;
  int in_EDX;
  long in_R8;
  undefined8 in_R9;
  int i8;
  LodePNGColorMode mode8;
  int i16;
  size_t j;
  LodePNGColorMode mode16;
  LodePNGICC icc;
  uint use_icc;
  uchar *data;
  float *im;
  int bit16;
  LodePNGInfo *info;
  LodePNGColorMode *mode_out;
  size_t n;
  size_t c;
  size_t i;
  uint error;
  LodePNGColorType colortype;
  float local_21c;
  float local_218;
  float local_214;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  float fVar7;
  float local_208;
  uint in_stack_fffffffffffffdfc;
  LodePNGInfo *in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  float *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  LodePNGInfo *in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  float *in_stack_fffffffffffffe50;
  float *in_stack_fffffffffffffe58;
  LodePNGICC *in_stack_fffffffffffffe70;
  float *in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  LodePNGColorMode *in_stack_fffffffffffffec0;
  LodePNGColorMode *in_stack_fffffffffffffec8;
  uchar *in_stack_fffffffffffffed0;
  uchar *in_stack_fffffffffffffed8;
  ulong local_40;
  ulong local_38;
  uint local_2c;
  
  uVar2 = *(uint *)(in_R8 + 0x9c);
  lodepng_icc_init((LodePNGICC *)0x141a17);
  if (*(int *)(in_R8 + 0x1a8) != 0) {
    local_2c = parseICC((LodePNGICC *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        (uchar *)in_stack_fffffffffffffe40,
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    if (local_2c != 0) goto LAB_00141f99;
    validateICC((LodePNGICC *)&stack0xfffffffffffffe60);
  }
  pvVar4 = lodepng_malloc(0x141a9d);
  local_2c = convertFromXYZ_chrm(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                 in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
                                 in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                                 in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                                 (uint)in_stack_fffffffffffffe80);
  if (local_2c == 0) {
    convertFromXYZ_gamma
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
               in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
               (LodePNGICC *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    pvVar5 = lodepng_malloc(0x141b60);
    colortype = (LodePNGColorType)((ulong)in_R9 >> 0x20);
    if (uVar2 < 9) {
      lodepng_color_mode_make(colortype,(uint)in_R9);
      for (local_38 = 0; local_38 < (uint)(in_EDX * in_ECX); local_38 = local_38 + 1) {
        for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
          pfVar1 = (float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
          if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
            local_214 = *(float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
          }
          else {
            local_214 = 0.0;
          }
          if (1.0 <= local_214) {
            local_21c = 1.0;
          }
          else {
            pfVar1 = (float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
            if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
              local_218 = *(float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
            }
            else {
              local_218 = 0.0;
            }
            local_21c = local_218;
          }
          *(char *)((long)pvVar5 + local_38 * 4 + local_40) = (char)(int)(local_21c * 255.0 + 0.5);
        }
      }
      local_2c = lodepng_convert(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                 (uint)in_stack_fffffffffffffebc,(uint)in_stack_fffffffffffffeb8);
    }
    else {
      lodepng_color_mode_make(colortype,(uint)in_R9);
      for (local_38 = 0; local_38 < (uint)(in_EDX * in_ECX); local_38 = local_38 + 1) {
        for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
          lVar6 = local_38 * 8 + local_40 * 2;
          pfVar1 = (float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
          if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
            local_208 = *(float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
          }
          else {
            local_208 = 0.0;
          }
          if (1.0 <= local_208) {
            fVar7 = 1.0;
          }
          else {
            pfVar1 = (float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
            if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
              fVar7 = *(float *)((long)pvVar4 + (local_38 * 4 + local_40) * 4);
            }
            else {
              fVar7 = 0.0;
            }
          }
          iVar3 = (int)(fVar7 * 65535.0 + 0.5);
          *(char *)((long)pvVar5 + lVar6) = (char)((uint)iVar3 >> 8);
          *(char *)((long)pvVar5 + lVar6 + 1) = (char)iVar3;
        }
      }
      local_2c = lodepng_convert(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                 (uint)in_stack_fffffffffffffebc,(uint)in_stack_fffffffffffffeb8);
    }
  }
LAB_00141f99:
  lodepng_icc_cleanup((LodePNGICC *)0x141fa6);
  lodepng_free((void *)0x141fb3);
  lodepng_free((void *)0x141fc0);
  return local_2c;
}

Assistant:

unsigned convertFromXYZ(unsigned char* out, const float* in, unsigned w, unsigned h,
                        const LodePNGState* state,
                        const float whitepoint[3], unsigned rendering_intent) {
  unsigned error = 0;
  size_t i, c;
  size_t n = w * h;
  const LodePNGColorMode* mode_out = &state->info_raw;
  const LodePNGInfo* info = &state->info_png;
  int bit16 = mode_out->bitdepth > 8;
  float* im = 0;
  unsigned char* data = 0;

  /* parse ICC if present */
  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }

  /* Handle gamut */
  im = (float*)lodepng_malloc(w * h * 4 * sizeof(float));
  error = convertFromXYZ_chrm(im, in, w, h, info, use_icc, &icc, whitepoint, rendering_intent);
  if(error) goto cleanup;

  /* Handle transfer function */
  /* Input is floating point, so lookup table cannot be used, but it's ensured to use float pow, not the slower double pow. */
  convertFromXYZ_gamma(im, w, h, info, use_icc, &icc);

  /* Convert to integer output */
  data = (unsigned char*)lodepng_malloc(w * h * 8);
  /* TODO: check if also 1/2/4 bit case needed: rounding is at different fine-grainedness for 8 and 16 bits below. */
  if(bit16) {
    LodePNGColorMode mode16 = lodepng_color_mode_make(LCT_RGBA, 16);
    for(i = 0; i < n; i++) {
      for(c = 0; c < 4; c++) {
        size_t j = i * 8 + c * 2;
        int i16 = (int)(0.5f + 65535.0f * LODEPNG_MIN(LODEPNG_MAX(0.0f, im[i * 4 + c]), 1.0f));
        data[j + 0] = i16 >> 8;
        data[j + 1] = i16 & 255;
      }
    }
    error = lodepng_convert(out, data, mode_out, &mode16, w, h);
    if(error) goto cleanup;
  } else {
    LodePNGColorMode mode8 = lodepng_color_mode_make(LCT_RGBA, 8);
    for(i = 0; i < n; i++) {
      for(c = 0; c < 4; c++) {
        int i8 = (int)(0.5f + 255.0f * LODEPNG_MIN(LODEPNG_MAX(0.0f, im[i * 4 + c]), 1.0f));
        data[i * 4 + c] = i8;
      }
    }
    error = lodepng_convert(out, data, mode_out, &mode8, w, h);
    if(error) goto cleanup;
  }

cleanup:
  lodepng_icc_cleanup(&icc);
  lodepng_free(im);
  lodepng_free(data);
  return error;
}